

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int curve25519_sha256(LIBSSH2_SESSION *session,uchar *data,size_t data_len,uchar *public_key,
                     uchar *private_key,kmdhgGPshakex_state_t *exchange_state)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  BIGNUM *pBVar4;
  undefined8 uVar5;
  uchar *puVar6;
  size_t sVar7;
  ulong uVar8;
  undefined4 uVar9;
  ulong local_168;
  size_t len_5;
  EVP_MD_CTX *hash_5;
  void *pvStack_150;
  int free_key_1;
  uchar *key_1;
  size_t len_4;
  EVP_MD_CTX *hash_4;
  void *pvStack_130;
  int free_key;
  uchar *key;
  size_t len_3;
  EVP_MD_CTX *hash_3;
  size_t len_2;
  EVP_MD_CTX *hash_2;
  int free_secret_1;
  int free_iv_1;
  uchar *secret_1;
  uchar *iv_1;
  size_t len_1;
  EVP_MD_CTX *hash_1;
  size_t len;
  EVP_MD_CTX *hash;
  int free_secret;
  int free_iv;
  uchar *secret;
  uchar *iv;
  size_t digest_length;
  int hok;
  EVP_MD_CTX *ctx;
  EVP_MD_CTX *fingerprint_ctx_2;
  EVP_MD_CTX *fingerprint_ctx_1;
  EVP_MD_CTX *fingerprint_ctx;
  string_buf buf;
  size_t hostkey_len;
  size_t server_public_key_len;
  uchar *server_host_key;
  uchar *server_public_key;
  int local_48;
  int public_key_len;
  int rc;
  int ret;
  kmdhgGPshakex_state_t *exchange_state_local;
  uchar *private_key_local;
  uchar *public_key_local;
  size_t data_len_local;
  uchar *data_local;
  LIBSSH2_SESSION *session_local;
  
  public_key_len = 0;
  server_public_key._4_4_ = 0x20;
  _rc = exchange_state;
  exchange_state_local = (kmdhgGPshakex_state_t *)private_key;
  private_key_local = public_key;
  public_key_local = (uchar *)data_len;
  data_len_local = (size_t)data;
  data_local = (uchar *)session;
  if (data_len < 5) {
    iVar2 = _libssh2_error(session,-10,"Data is too short");
    return iVar2;
  }
  if (exchange_state->state == libssh2_NB_state_idle) {
    pBVar4 = BN_new();
    _rc->k = (BIGNUM *)pBVar4;
    _rc->state = libssh2_NB_state_created;
  }
  if (_rc->state == libssh2_NB_state_created) {
    if (public_key_local < (uchar *)0x5) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-0xe,"Unexpected curve25519 key length 1");
      goto LAB_0011dc83;
    }
    fingerprint_ctx = (EVP_MD_CTX *)data_len_local;
    buf.dataptr = public_key_local;
    buf.data = (uchar *)(data_len_local + 1);
    iVar2 = _libssh2_get_string((string_buf *)&fingerprint_ctx,(uchar **)&server_public_key_len,
                                &buf.len);
    if (iVar2 != 0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-0xe,"Unexpected curve25519 key length 2");
      goto LAB_0011dc83;
    }
    *(undefined4 *)(data_local + 0xd0) = (undefined4)buf.len;
    uVar5 = (**(code **)(data_local + 8))(*(undefined4 *)(data_local + 0xd0),data_local);
    *(undefined8 *)(data_local + 200) = uVar5;
    if (*(long *)(data_local + 200) == 0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-6,
                          "Unable to allocate memory for a copy of the host curve25519 key");
      goto LAB_0011dc83;
    }
    memcpy(*(void **)(data_local + 200),(void *)server_public_key_len,
           (ulong)*(uint *)(data_local + 0xd0));
    iVar2 = _libssh2_md5_init(&fingerprint_ctx_1);
    if (((iVar2 == 0) ||
        (iVar2 = _libssh2_md5_update(&fingerprint_ctx_1,*(void **)(data_local + 200),
                                     (ulong)*(uint *)(data_local + 0xd0)), iVar2 == 0)) ||
       (iVar2 = _libssh2_md5_final(&fingerprint_ctx_1,data_local + 0xd4), iVar2 == 0)) {
      data_local[0xe4] = '\0';
      data_local[0xe5] = '\0';
      data_local[0xe6] = '\0';
      data_local[0xe7] = '\0';
    }
    else {
      data_local[0xe4] = '\x01';
      data_local[0xe5] = '\0';
      data_local[0xe6] = '\0';
      data_local[0xe7] = '\0';
    }
    iVar2 = _libssh2_sha1_init(&fingerprint_ctx_2);
    if (((iVar2 == 0) ||
        (iVar2 = _libssh2_sha1_update
                           (&fingerprint_ctx_2,*(void **)(data_local + 200),
                            (ulong)*(uint *)(data_local + 0xd0)), iVar2 == 0)) ||
       (iVar2 = _libssh2_sha1_final(&fingerprint_ctx_2,data_local + 0xe8), iVar2 == 0)) {
      data_local[0xfc] = '\0';
      data_local[0xfd] = '\0';
      data_local[0xfe] = '\0';
      data_local[0xff] = '\0';
    }
    else {
      data_local[0xfc] = '\x01';
      data_local[0xfd] = '\0';
      data_local[0xfe] = '\0';
      data_local[0xff] = '\0';
    }
    iVar2 = _libssh2_sha256_init(&ctx);
    if (((iVar2 == 0) ||
        (iVar2 = _libssh2_sha256_update
                           (&ctx,*(void **)(data_local + 200),(ulong)*(uint *)(data_local + 0xd0)),
        iVar2 == 0)) || (iVar2 = _libssh2_sha256_final(&ctx,data_local + 0x100), iVar2 == 0)) {
      data_local[0x120] = '\0';
      data_local[0x121] = '\0';
      data_local[0x122] = '\0';
      data_local[0x123] = '\0';
    }
    else {
      data_local[0x120] = '\x01';
      data_local[0x121] = '\0';
      data_local[0x122] = '\0';
      data_local[0x123] = '\0';
    }
    iVar2 = (**(code **)(*(long *)(data_local + 0xb8) + 0x10))
                      (data_local,*(undefined8 *)(data_local + 200),
                       *(undefined4 *)(data_local + 0xd0),data_local + 0xc0);
    if (iVar2 != 0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-10,
                          "Unable to initialize hostkey importer curve25519");
      goto LAB_0011dc83;
    }
    iVar2 = _libssh2_get_string((string_buf *)&fingerprint_ctx,&server_host_key,&hostkey_len);
    if (iVar2 != 0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-0xe,"Unexpected curve25519 key length");
      goto LAB_0011dc83;
    }
    if (hostkey_len != 0x20) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-10,
                          "Unexpected curve25519 server public key length");
      goto LAB_0011dc83;
    }
    iVar2 = _libssh2_get_string((string_buf *)&fingerprint_ctx,&_rc->h_sig,&_rc->h_sig_len);
    if (iVar2 != 0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-10,
                          "Unexpected curve25519 server sig length");
      goto LAB_0011dc83;
    }
    local_48 = _libssh2_curve25519_gen_k(&_rc->k,(uint8_t *)exchange_state_local,server_host_key);
    if (local_48 != 0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-5,
                          "Unable to create curve25519 shared secret");
      goto LAB_0011dc83;
    }
    iVar2 = BN_num_bits((BIGNUM *)_rc->k);
    _rc->k_value_len = (long)((iVar2 + 7) / 8 + 5);
    iVar2 = BN_num_bits((BIGNUM *)_rc->k);
    if (iVar2 % 8 != 0) {
      _rc->k_value_len = _rc->k_value_len - 1;
    }
    puVar6 = (uchar *)(**(code **)(data_local + 8))(_rc->k_value_len,data_local);
    _rc->k_value = puVar6;
    if (_rc->k_value == (uchar *)0x0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-6,"Unable to allocate buffer for K");
      goto LAB_0011dc83;
    }
    _libssh2_htonu32(_rc->k_value,(int)_rc->k_value_len - 4);
    iVar2 = BN_num_bits((BIGNUM *)_rc->k);
    if (iVar2 % 8 == 0) {
      _rc->k_value[4] = '\0';
      BN_bn2bin((BIGNUM *)_rc->k,_rc->k_value + 5);
    }
    else {
      BN_bn2bin((BIGNUM *)_rc->k,_rc->k_value + 4);
    }
    iVar2 = _libssh2_sha256_init((EVP_MD_CTX **)&stack0xffffffffffffff58);
    if (iVar2 == 0) {
      local_48 = -1;
    }
    else {
      _rc->exchange_hash = &stack0xffffffffffffff58;
      digest_length._4_4_ = 1;
      if (*(long *)(data_local + 0x1b0) == 0) {
        _libssh2_htonu32(_rc->h_sig_comp,0x1a);
        uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp,4);
        digest_length._4_4_ = uVar3 & digest_length._4_4_;
        uVar3 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff58,"SSH-2.0-libssh2_1.11.1_DEV",0x1a
                          );
        digest_length._4_4_ = uVar3 & digest_length._4_4_;
      }
      else {
        puVar6 = _rc->h_sig_comp;
        sVar7 = strlen(*(char **)(data_local + 0x1b0));
        _libssh2_htonu32(puVar6,(int)sVar7 - 2);
        uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp,4);
        digest_length._4_4_ = uVar3 & digest_length._4_4_;
        pvVar1 = *(void **)(data_local + 0x1b0);
        sVar7 = strlen(*(char **)(data_local + 0x1b0));
        uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,pvVar1,sVar7 - 2);
        digest_length._4_4_ = uVar3 & digest_length._4_4_;
      }
      puVar6 = _rc->h_sig_comp;
      sVar7 = strlen(*(char **)(data_local + 0x140));
      _libssh2_htonu32(puVar6,(uint32_t)sVar7);
      uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp,4);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      pvVar1 = *(void **)(data_local + 0x140);
      sVar7 = strlen(*(char **)(data_local + 0x140));
      uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,pvVar1,sVar7);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      _libssh2_htonu32(_rc->h_sig_comp,(uint32_t)*(undefined8 *)(data_local + 0x1c0));
      uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp,4);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      uVar3 = _libssh2_sha256_update
                        ((EVP_MD_CTX **)&stack0xffffffffffffff58,*(void **)(data_local + 0x1b8),
                         *(size_t *)(data_local + 0x1c0));
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      _libssh2_htonu32(_rc->h_sig_comp,(uint32_t)*(undefined8 *)(data_local + 0x150));
      uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp,4);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      uVar3 = _libssh2_sha256_update
                        ((EVP_MD_CTX **)&stack0xffffffffffffff58,*(void **)(data_local + 0x148),
                         *(size_t *)(data_local + 0x150));
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      _libssh2_htonu32(_rc->h_sig_comp,*(uint32_t *)(data_local + 0xd0));
      uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp,4);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      uVar3 = _libssh2_sha256_update
                        ((EVP_MD_CTX **)&stack0xffffffffffffff58,*(void **)(data_local + 200),
                         (ulong)*(uint *)(data_local + 0xd0));
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      _libssh2_htonu32(_rc->h_sig_comp,server_public_key._4_4_);
      uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp,4);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      uVar3 = _libssh2_sha256_update
                        ((EVP_MD_CTX **)&stack0xffffffffffffff58,private_key_local,
                         (long)(int)server_public_key._4_4_);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      _libssh2_htonu32(_rc->h_sig_comp,(uint32_t)hostkey_len);
      uVar3 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp,4);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      uVar3 = _libssh2_sha256_update
                        ((EVP_MD_CTX **)&stack0xffffffffffffff58,server_host_key,hostkey_len);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      uVar3 = _libssh2_sha256_update
                        ((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->k_value,_rc->k_value_len);
      digest_length._4_4_ = uVar3 & digest_length._4_4_;
      if ((digest_length._4_4_ == 0) ||
         (iVar2 = _libssh2_sha256_final((EVP_MD_CTX **)&stack0xffffffffffffff58,_rc->h_sig_comp),
         iVar2 == 0)) {
        local_48 = -1;
      }
      else {
        iVar2 = (**(code **)(*(long *)(data_local + 0xb8) + 0x28))
                          (data_local,_rc->h_sig,_rc->h_sig_len,_rc->h_sig_comp);
        if (iVar2 != 0) {
          local_48 = -1;
        }
      }
    }
    if (local_48 != 0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,-0xb,
                          "Unable to verify hostkey signature curve25519");
      goto LAB_0011dc83;
    }
    _rc->c = '\x15';
    _rc->state = libssh2_NB_state_sent;
  }
  if (_rc->state == libssh2_NB_state_sent) {
    local_48 = _libssh2_transport_send((LIBSSH2_SESSION *)data_local,&_rc->c,1,(uchar *)0x0,0);
    if (local_48 == -0x25) {
      return -0x25;
    }
    if (local_48 != 0) {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,local_48,
                          "Unable to send NEWKEYS message curve25519");
      goto LAB_0011dc83;
    }
    _rc->state = libssh2_NB_state_sent2;
  }
  if (_rc->state == libssh2_NB_state_sent2) {
    uVar8 = 0;
    local_48 = _libssh2_packet_require
                         ((LIBSSH2_SESSION *)data_local,'\x15',&_rc->tmp,&_rc->tmp_len,0,
                          (uchar *)0x0,0,&_rc->req_state);
    if (local_48 == -0x25) {
      return -0x25;
    }
    if (local_48 == 0) {
      *(uint *)(data_local + 0x80) = *(uint *)(data_local + 0x80) | 4;
      (**(code **)(data_local + 0x18))(_rc->tmp,data_local);
      if (*(long *)(data_local + 0xa0) == 0) {
        iv = (uchar *)0x20;
        uVar5 = (**(code **)(data_local + 8))(0x20,data_local);
        *(undefined8 *)(data_local + 0xa0) = uVar5;
        if (*(long *)(data_local + 0xa0) == 0) {
          public_key_len =
               _libssh2_error((LIBSSH2_SESSION *)data_local,-6,
                              "Unable to allocate buffer for SHA digest");
          goto LAB_0011dc83;
        }
        memcpy(*(void **)(data_local + 0xa0),_rc->h_sig_comp,(size_t)iv);
        *(int *)(data_local + 0xa8) = (int)iv;
      }
      if (*(long *)(*(long *)(data_local + 0x1c8) + 0x38) != 0) {
        (**(code **)(*(long *)(data_local + 0x1c8) + 0x38))(data_local,data_local + 0x1d0);
      }
      if (*(long *)(*(long *)(data_local + 0x1c8) + 0x28) != 0) {
        secret = (uchar *)0x0;
        _free_secret = (void *)0x0;
        hash._4_4_ = 0;
        hash._0_4_ = 0;
        hash_1 = (EVP_MD_CTX *)0x0;
        secret = (uchar *)(**(code **)(data_local + 8))
                                    ((long)(*(int *)(*(long *)(data_local + 0x1c8) + 0x14) + 0x20),
                                     data_local);
        if (secret != (uchar *)0x0) {
          for (; hash_1 < (EVP_MD_CTX *)(long)*(int *)(*(long *)(data_local + 0x1c8) + 0x14);
              hash_1 = hash_1 + 0x20) {
            iVar2 = _libssh2_sha256_init((EVP_MD_CTX **)&len);
            if (((iVar2 == 0) ||
                (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len,_rc->k_value,_rc->k_value_len),
                iVar2 == 0)) ||
               (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len,_rc->h_sig_comp,0x20), iVar2 == 0
               )) {
              (**(code **)(data_local + 0x18))(secret,data_local);
              secret = (uchar *)0x0;
              break;
            }
            if (hash_1 == (EVP_MD_CTX *)0x0) {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len,"A",1);
              if ((iVar2 == 0) ||
                 (iVar2 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len,*(void **)(data_local + 0xa0),
                                     (ulong)*(uint *)(data_local + 0xa8)), iVar2 == 0)) {
                (**(code **)(data_local + 0x18))(secret,data_local);
                secret = (uchar *)0x0;
                break;
              }
            }
            else {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len,secret,(size_t)hash_1);
              if (iVar2 == 0) {
                (**(code **)(data_local + 0x18))(secret,data_local);
                secret = (uchar *)0x0;
                break;
              }
            }
            iVar2 = _libssh2_sha256_final((EVP_MD_CTX **)&len,secret + (long)hash_1);
            if (iVar2 == 0) {
              (**(code **)(data_local + 0x18))(secret,data_local);
              secret = (uchar *)0x0;
              break;
            }
          }
        }
        if (secret == (uchar *)0x0) {
          public_key_len = -1;
          goto LAB_0011dc83;
        }
        iv_1 = (uchar *)0x0;
        if (_free_secret == (void *)0x0) {
          _free_secret = (void *)(**(code **)(data_local + 8))
                                           ((long)(*(int *)(*(long *)(data_local + 0x1c8) + 0x18) +
                                                  0x20),data_local);
        }
        uVar9 = (undefined4)(uVar8 >> 0x20);
        if (_free_secret != (void *)0x0) {
          for (; uVar9 = (undefined4)(uVar8 >> 0x20),
              iv_1 < (uchar *)(long)*(int *)(*(long *)(data_local + 0x1c8) + 0x18);
              iv_1 = iv_1 + 0x20) {
            iVar2 = _libssh2_sha256_init((EVP_MD_CTX **)&len_1);
            uVar9 = (undefined4)(uVar8 >> 0x20);
            if (iVar2 == 0) {
LAB_0011cd3d:
              (**(code **)(data_local + 0x18))(_free_secret,data_local);
              _free_secret = (void *)0x0;
              break;
            }
            iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_1,_rc->k_value,_rc->k_value_len);
            uVar9 = (undefined4)(uVar8 >> 0x20);
            if (iVar2 == 0) goto LAB_0011cd3d;
            iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_1,_rc->h_sig_comp,0x20);
            uVar9 = (undefined4)(uVar8 >> 0x20);
            if (iVar2 == 0) goto LAB_0011cd3d;
            if (iv_1 == (uchar *)0x0) {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_1,"C",1);
              uVar9 = (undefined4)(uVar8 >> 0x20);
              if (iVar2 != 0) {
                iVar2 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&len_1,*(void **)(data_local + 0xa0),
                                   (ulong)*(uint *)(data_local + 0xa8));
                uVar9 = (undefined4)(uVar8 >> 0x20);
                if (iVar2 != 0) goto LAB_0011ce1b;
              }
              (**(code **)(data_local + 0x18))(_free_secret,data_local);
              _free_secret = (void *)0x0;
              break;
            }
            iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_1,_free_secret,(size_t)iv_1);
            uVar9 = (undefined4)(uVar8 >> 0x20);
            if (iVar2 == 0) {
              (**(code **)(data_local + 0x18))(_free_secret,data_local);
              _free_secret = (void *)0x0;
              break;
            }
LAB_0011ce1b:
            iVar2 = _libssh2_sha256_final
                              ((EVP_MD_CTX **)&len_1,(uchar *)((long)_free_secret + (long)iv_1));
            uVar9 = (undefined4)(uVar8 >> 0x20);
            if (iVar2 == 0) {
              (**(code **)(data_local + 0x18))(_free_secret,data_local);
              _free_secret = (void *)0x0;
              break;
            }
          }
        }
        if (_free_secret == (void *)0x0) {
          (**(code **)(data_local + 0x18))(secret,data_local);
          public_key_len = -5;
          goto LAB_0011dc83;
        }
        uVar8 = CONCAT44(uVar9,1);
        iVar2 = (**(code **)(*(long *)(data_local + 0x1c8) + 0x28))
                          (data_local,*(undefined8 *)(data_local + 0x1c8),secret,(long)&hash + 4,
                           _free_secret,&hash,uVar8,data_local + 0x1d0);
        if (iVar2 != 0) {
          (**(code **)(data_local + 0x18))(secret,data_local);
          (**(code **)(data_local + 0x18))(_free_secret,data_local);
          public_key_len = -5;
          goto LAB_0011dc83;
        }
        if (hash._4_4_ != 0) {
          explicit_bzero(secret,(long)*(int *)(*(long *)(data_local + 0x1c8) + 0x14));
          (**(code **)(data_local + 0x18))(secret,data_local);
        }
        if ((int)hash != 0) {
          explicit_bzero(_free_secret,(long)*(int *)(*(long *)(data_local + 0x1c8) + 0x18));
          (**(code **)(data_local + 0x18))(_free_secret,data_local);
        }
      }
      if (*(long *)(*(long *)(data_local + 0x158) + 0x38) != 0) {
        (**(code **)(*(long *)(data_local + 0x158) + 0x38))(data_local,data_local + 0x160);
      }
      if (*(long *)(*(long *)(data_local + 0x158) + 0x28) != 0) {
        secret_1 = (uchar *)0x0;
        _free_secret_1 = (void *)0x0;
        hash_2._4_4_ = 0;
        hash_2._0_4_ = 0;
        hash_3 = (EVP_MD_CTX *)0x0;
        secret_1 = (uchar *)(**(code **)(data_local + 8))
                                      ((long)(*(int *)(*(long *)(data_local + 0x158) + 0x14) + 0x20)
                                       ,data_local);
        if (secret_1 != (uchar *)0x0) {
          for (; hash_3 < (EVP_MD_CTX *)(long)*(int *)(*(long *)(data_local + 0x158) + 0x14);
              hash_3 = hash_3 + 0x20) {
            iVar2 = _libssh2_sha256_init((EVP_MD_CTX **)&len_2);
            if (((iVar2 == 0) ||
                (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_2,_rc->k_value,_rc->k_value_len)
                , iVar2 == 0)) ||
               (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_2,_rc->h_sig_comp,0x20),
               iVar2 == 0)) {
              (**(code **)(data_local + 0x18))(secret_1,data_local);
              secret_1 = (uchar *)0x0;
              break;
            }
            if (hash_3 == (EVP_MD_CTX *)0x0) {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_2,"B",1);
              if ((iVar2 == 0) ||
                 (iVar2 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_2,*(void **)(data_local + 0xa0),
                                     (ulong)*(uint *)(data_local + 0xa8)), iVar2 == 0)) {
                (**(code **)(data_local + 0x18))(secret_1,data_local);
                secret_1 = (uchar *)0x0;
                break;
              }
            }
            else {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_2,secret_1,(size_t)hash_3);
              if (iVar2 == 0) {
                (**(code **)(data_local + 0x18))(secret_1,data_local);
                secret_1 = (uchar *)0x0;
                break;
              }
            }
            iVar2 = _libssh2_sha256_final((EVP_MD_CTX **)&len_2,secret_1 + (long)hash_3);
            if (iVar2 == 0) {
              (**(code **)(data_local + 0x18))(secret_1,data_local);
              secret_1 = (uchar *)0x0;
              break;
            }
          }
        }
        if (secret_1 == (uchar *)0x0) {
          public_key_len = -5;
          goto LAB_0011dc83;
        }
        key = (uchar *)0x0;
        if (_free_secret_1 == (void *)0x0) {
          _free_secret_1 =
               (void *)(**(code **)(data_local + 8))
                                 ((long)(*(int *)(*(long *)(data_local + 0x158) + 0x18) + 0x20),
                                  data_local);
        }
        if (_free_secret_1 != (void *)0x0) {
          for (; key < (uchar *)(long)*(int *)(*(long *)(data_local + 0x158) + 0x18);
              key = key + 0x20) {
            iVar2 = _libssh2_sha256_init((EVP_MD_CTX **)&len_3);
            if (((iVar2 == 0) ||
                (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_3,_rc->k_value,_rc->k_value_len)
                , iVar2 == 0)) ||
               (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_3,_rc->h_sig_comp,0x20),
               iVar2 == 0)) {
              (**(code **)(data_local + 0x18))(_free_secret_1,data_local);
              _free_secret_1 = (void *)0x0;
              break;
            }
            if (key == (uchar *)0x0) {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_3,"D",1);
              if ((iVar2 == 0) ||
                 (iVar2 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_3,*(void **)(data_local + 0xa0),
                                     (ulong)*(uint *)(data_local + 0xa8)), iVar2 == 0)) {
                (**(code **)(data_local + 0x18))(_free_secret_1,data_local);
                _free_secret_1 = (void *)0x0;
                break;
              }
            }
            else {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_3,_free_secret_1,(size_t)key);
              if (iVar2 == 0) {
                (**(code **)(data_local + 0x18))(_free_secret_1,data_local);
                _free_secret_1 = (void *)0x0;
                break;
              }
            }
            iVar2 = _libssh2_sha256_final
                              ((EVP_MD_CTX **)&len_3,(uchar *)((long)_free_secret_1 + (long)key));
            if (iVar2 == 0) {
              (**(code **)(data_local + 0x18))(_free_secret_1,data_local);
              _free_secret_1 = (void *)0x0;
              break;
            }
          }
        }
        if (_free_secret_1 == (void *)0x0) {
          (**(code **)(data_local + 0x18))(secret_1,data_local);
          public_key_len = -5;
          goto LAB_0011dc83;
        }
        iVar2 = (**(code **)(*(long *)(data_local + 0x158) + 0x28))
                          (data_local,*(undefined8 *)(data_local + 0x158),secret_1,(long)&hash_2 + 4
                           ,_free_secret_1,&hash_2,uVar8 & 0xffffffff00000000,data_local + 0x160);
        if (iVar2 != 0) {
          (**(code **)(data_local + 0x18))(secret_1,data_local);
          (**(code **)(data_local + 0x18))(_free_secret_1,data_local);
          public_key_len = -5;
          goto LAB_0011dc83;
        }
        if (hash_2._4_4_ != 0) {
          explicit_bzero(secret_1,(long)*(int *)(*(long *)(data_local + 0x158) + 0x14));
          (**(code **)(data_local + 0x18))(secret_1,data_local);
        }
        if ((int)hash_2 != 0) {
          explicit_bzero(_free_secret_1,(long)*(int *)(*(long *)(data_local + 0x158) + 0x18));
          (**(code **)(data_local + 0x18))(_free_secret_1,data_local);
        }
      }
      if (*(long *)(*(long *)(data_local + 0x1d8) + 0x20) != 0) {
        (**(code **)(*(long *)(data_local + 0x1d8) + 0x20))(data_local,data_local + 0x1e8);
      }
      if (*(long *)(*(long *)(data_local + 0x1d8) + 0x10) != 0) {
        pvStack_130 = (void *)0x0;
        hash_4._4_4_ = 0;
        key_1 = (uchar *)0x0;
        pvStack_130 = (void *)(**(code **)(data_local + 8))
                                        ((long)(*(int *)(*(long *)(data_local + 0x1d8) + 0xc) + 0x20
                                               ),data_local);
        if (pvStack_130 != (void *)0x0) {
          for (; key_1 < (uchar *)(long)*(int *)(*(long *)(data_local + 0x1d8) + 0xc);
              key_1 = key_1 + 0x20) {
            iVar2 = _libssh2_sha256_init((EVP_MD_CTX **)&len_4);
            if (((iVar2 == 0) ||
                (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_4,_rc->k_value,_rc->k_value_len)
                , iVar2 == 0)) ||
               (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_4,_rc->h_sig_comp,0x20),
               iVar2 == 0)) {
              (**(code **)(data_local + 0x18))(pvStack_130,data_local);
              pvStack_130 = (void *)0x0;
              break;
            }
            if (key_1 == (uchar *)0x0) {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_4,"E",1);
              if ((iVar2 == 0) ||
                 (iVar2 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_4,*(void **)(data_local + 0xa0),
                                     (ulong)*(uint *)(data_local + 0xa8)), iVar2 == 0)) {
                (**(code **)(data_local + 0x18))(pvStack_130,data_local);
                pvStack_130 = (void *)0x0;
                break;
              }
            }
            else {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_4,pvStack_130,(size_t)key_1);
              if (iVar2 == 0) {
                (**(code **)(data_local + 0x18))(pvStack_130,data_local);
                pvStack_130 = (void *)0x0;
                break;
              }
            }
            iVar2 = _libssh2_sha256_final
                              ((EVP_MD_CTX **)&len_4,(uchar *)((long)pvStack_130 + (long)key_1));
            if (iVar2 == 0) {
              (**(code **)(data_local + 0x18))(pvStack_130,data_local);
              pvStack_130 = (void *)0x0;
              break;
            }
          }
        }
        if (pvStack_130 == (void *)0x0) {
          public_key_len = -5;
          goto LAB_0011dc83;
        }
        (**(code **)(*(long *)(data_local + 0x1d8) + 0x10))
                  (data_local,pvStack_130,(long)&hash_4 + 4,data_local + 0x1e8);
        if (hash_4._4_4_ != 0) {
          explicit_bzero(pvStack_130,(long)*(int *)(*(long *)(data_local + 0x1d8) + 0xc));
          (**(code **)(data_local + 0x18))(pvStack_130,data_local);
        }
      }
      if (*(long *)(*(long *)(data_local + 0x168) + 0x20) != 0) {
        (**(code **)(*(long *)(data_local + 0x168) + 0x20))(data_local,data_local + 0x178);
      }
      if (*(long *)(*(long *)(data_local + 0x168) + 0x10) != 0) {
        pvStack_150 = (void *)0x0;
        hash_5._4_4_ = 0;
        local_168 = 0;
        pvStack_150 = (void *)(**(code **)(data_local + 8))
                                        ((long)(*(int *)(*(long *)(data_local + 0x168) + 0xc) + 0x20
                                               ),data_local);
        if (pvStack_150 != (void *)0x0) {
          for (; local_168 < (ulong)(long)*(int *)(*(long *)(data_local + 0x168) + 0xc);
              local_168 = local_168 + 0x20) {
            iVar2 = _libssh2_sha256_init((EVP_MD_CTX **)&len_5);
            if (((iVar2 == 0) ||
                (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_5,_rc->k_value,_rc->k_value_len)
                , iVar2 == 0)) ||
               (iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_5,_rc->h_sig_comp,0x20),
               iVar2 == 0)) {
              (**(code **)(data_local + 0x18))(pvStack_150,data_local);
              pvStack_150 = (void *)0x0;
              break;
            }
            if (local_168 == 0) {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_5,"F",1);
              if ((iVar2 == 0) ||
                 (iVar2 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_5,*(void **)(data_local + 0xa0),
                                     (ulong)*(uint *)(data_local + 0xa8)), iVar2 == 0)) {
                (**(code **)(data_local + 0x18))(pvStack_150,data_local);
                pvStack_150 = (void *)0x0;
                break;
              }
            }
            else {
              iVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&len_5,pvStack_150,local_168);
              if (iVar2 == 0) {
                (**(code **)(data_local + 0x18))(pvStack_150,data_local);
                pvStack_150 = (void *)0x0;
                break;
              }
            }
            iVar2 = _libssh2_sha256_final
                              ((EVP_MD_CTX **)&len_5,(uchar *)((long)pvStack_150 + local_168));
            if (iVar2 == 0) {
              (**(code **)(data_local + 0x18))(pvStack_150,data_local);
              pvStack_150 = (void *)0x0;
              break;
            }
          }
        }
        if (pvStack_150 == (void *)0x0) {
          public_key_len = -5;
          goto LAB_0011dc83;
        }
        (**(code **)(*(long *)(data_local + 0x168) + 0x10))
                  (data_local,pvStack_150,(long)&hash_5 + 4,data_local + 0x178);
        if (hash_5._4_4_ != 0) {
          explicit_bzero(pvStack_150,(long)*(int *)(*(long *)(data_local + 0x168) + 0xc));
          (**(code **)(data_local + 0x18))(pvStack_150,data_local);
        }
      }
      if ((*(long *)(data_local + 0x1f0) != 0) &&
         (*(long *)(*(long *)(data_local + 0x1f0) + 0x28) != 0)) {
        (**(code **)(*(long *)(data_local + 0x1f0) + 0x28))(data_local,1,data_local + 0x1f8);
      }
      if (((*(long *)(data_local + 0x1f0) == 0) ||
          (*(long *)(*(long *)(data_local + 0x1f0) + 0x10) == 0)) ||
         (iVar2 = (**(code **)(*(long *)(data_local + 0x1f0) + 0x10))
                            (data_local,1,data_local + 0x1f8), iVar2 == 0)) {
        if ((*(long *)(data_local + 0x180) != 0) &&
           (*(long *)(*(long *)(data_local + 0x180) + 0x28) != 0)) {
          (**(code **)(*(long *)(data_local + 0x180) + 0x28))(data_local,0,data_local + 0x188);
        }
        if (((*(long *)(data_local + 0x180) != 0) &&
            (*(long *)(*(long *)(data_local + 0x180) + 0x10) != 0)) &&
           (iVar2 = (**(code **)(*(long *)(data_local + 0x180) + 0x10))
                              (data_local,0,data_local + 0x188), iVar2 != 0)) {
          public_key_len = -5;
        }
      }
      else {
        public_key_len = -5;
      }
    }
    else {
      public_key_len =
           _libssh2_error((LIBSSH2_SESSION *)data_local,local_48,
                          "Timed out waiting for NEWKEYS curve25519");
    }
  }
LAB_0011dc83:
  BN_clear_free((BIGNUM *)_rc->k);
  _rc->k = (BIGNUM *)0x0;
  if (_rc->k_value != (uchar *)0x0) {
    (**(code **)(data_local + 0x18))(_rc->k_value,data_local);
    _rc->k_value = (uchar *)0x0;
  }
  _rc->state = libssh2_NB_state_idle;
  return public_key_len;
}

Assistant:

static int
curve25519_sha256(LIBSSH2_SESSION *session, unsigned char *data,
                  size_t data_len,
                  unsigned char public_key[LIBSSH2_ED25519_KEY_LEN],
                  unsigned char private_key[LIBSSH2_ED25519_KEY_LEN],
                  kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;
    int public_key_len = LIBSSH2_ED25519_KEY_LEN;

    if(data_len < 5) {
        return _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                              "Data is too short");
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */
        unsigned char *server_public_key, *server_host_key;
        size_t server_public_key_len, hostkey_len;
        struct string_buf buf;

        if(data_len < 5) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected curve25519 key length 1");
            goto clean_exit;
        }

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* advance past packet type */

        if(_libssh2_get_string(&buf, &server_host_key, &hostkey_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected curve25519 key length 2");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)hostkey_len;
        session->server_hostkey = LIBSSH2_ALLOC(session,
                                                session->server_hostkey_len);
        if(!session->server_hostkey) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host curve25519 key");
            goto clean_exit;
        }

        memcpy(session->server_hostkey, server_host_key,
               session->server_hostkey_len);

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx) &&
               libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                  session->server_hostkey_len) &&
               libssh2_md5_final(fingerprint_ctx,
                                 session->server_hostkey_md5)) {
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx) &&
               libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len) &&
               libssh2_sha1_final(fingerprint_ctx,
                                  session->server_hostkey_sha1)) {
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx) &&
               libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                     session->server_hostkey_len) &&
               libssh2_sha256_final(fingerprint_ctx,
                                    session->server_hostkey_sha256)) {
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "curve25519");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected curve25519 key length");
            goto clean_exit;
        }

        if(server_public_key_len != LIBSSH2_ED25519_KEY_LEN) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected curve25519 server "
                                 "public key length");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected curve25519 server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_curve25519_gen_k(&exchange_state->k, private_key,
                                       server_public_key);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create curve25519 shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        }
        else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        /*/ verify hash */
        LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "curve25519");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message curve25519");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS curve25519");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message curve25519"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = SHA256_DIGEST_LENGTH;
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
            session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_SHA_VALUE_HASH(256, iv,
                                              session->local.crypt->
                                              iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_SHA_VALUE_HASH(256, secret,
                                              session->local.crypt->
                                              secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_SHA_VALUE_HASH(256, iv,
                                              session->remote.crypt->
                                              iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_SHA_VALUE_HASH(256, secret,
                                              session->remote.crypt->
                                              secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_SHA_VALUE_HASH(256, key,
                                              session->local.mac->
                                              key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_SHA_VALUE_HASH(256, key,
                                              session->remote.mac->
                                              key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;

    if(exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}